

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf-tool.cc
# Opt level: O2

int main(int argc,char **argv)

{
  string *psVar1;
  uint abbrev;
  pointer pbVar2;
  pointer psVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar9;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar10;
  typed_value<unsigned_int,_char> *ptVar11;
  basic_command_line_parser<char> *this;
  size_type sVar12;
  ostream *poVar13;
  size_type sVar14;
  any *paVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar16;
  uint *puVar17;
  long lVar18;
  uint64_t uVar19;
  int *piVar20;
  pointer pbVar21;
  uint64_t str_room;
  int local_364;
  pointer local_360;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  input;
  uint64_t str_offset;
  Elf_parser elf_parser;
  string_parser sp;
  string hash;
  vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_> local_238;
  string str;
  map map;
  string s;
  char usage_banner [52];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  positional_options_description popt;
  options_description optdesc;
  sha sha;
  path_type local_60;
  
  input.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  input.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  input.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string
            ((string *)&elf_parser,
             "sshash-elf -- tool for processing sshash stings in ELF files\nUsage: sshash-elf <--hashmap map> [options] [elf-input-files]\nOptions"
             ,(allocator *)&sp);
  boost::program_options::options_description::options_description
            (&optdesc,(string *)&elf_parser,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  std::__cxx11::string::~string((string *)&elf_parser);
  elf_parser.m_program_path._M_dataplus._M_p =
       (pointer)boost::program_options::options_description::add_options();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&elf_parser,"help");
  ptVar9 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(&input);
  ptVar9->m_composing = true;
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"input",(char *)ptVar9);
  ptVar10 = boost::program_options::value<std::__cxx11::string>();
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"hashmap,m",(char *)ptVar10);
  ptVar11 = boost::program_options::value<unsigned_int>();
  sp._fd = 8;
  ptVar11 = boost::program_options::typed_value<unsigned_int,_char>::default_value
                      (ptVar11,(uint *)&sp);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,(value_semantic *)"minlen,L",(char *)ptVar11);
  pcVar8 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar8,"dryrun");
  boost::program_options::options_description_easy_init::operator()(pcVar8,"verbose");
  boost::program_options::positional_options_description::positional_options_description(&popt);
  iVar6 = -1;
  boost::program_options::positional_options_description::add((char *)&popt,0x1150bb);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&elf_parser,argc,argv);
  this = boost::program_options::basic_command_line_parser<char>::options
                   ((basic_command_line_parser<char> *)&elf_parser,&optdesc);
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)this);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)&sp,this);
  boost::program_options::store((basic_parsed_options *)&sp,(variables_map *)optmap,false);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
             *)&sp);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&elf_parser);
  boost::program_options::notify((variables_map *)optmap);
  std::__cxx11::string::string((string *)&elf_parser,"help",(allocator *)&sp);
  sVar12 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                    *)(optmap + 0x10),&elf_parser.m_program_path);
  pbVar21 = input.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = input.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (sVar12 == 0) {
    std::__cxx11::string::~string((string *)&elf_parser);
    if (pbVar2 != pbVar21) {
      std::__cxx11::string::string((string *)&elf_parser,"verbose",(allocator *)&sp);
      sVar12 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                        *)(optmap + 0x10),&elf_parser.m_program_path);
      std::__cxx11::string::~string((string *)&elf_parser);
      std::__cxx11::string::string((string *)&elf_parser,"dryrun",(allocator *)&sp);
      sVar14 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                        *)(optmap + 0x10),&elf_parser.m_program_path);
      std::__cxx11::string::~string((string *)&elf_parser);
      builtin_strncpy(usage_banner,"usage: sshash-tool [<elf_file>] [<ssiMapFilename>]\n",0x34);
      if (argc < 3) {
        std::operator<<((ostream *)&std::cerr,usage_banner);
      }
      else {
        boost::property_tree::
        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::basic_ptree(&map.super_ptree);
        std::__cxx11::string::string((string *)&elf_parser,"hashmap",(allocator *)&sp);
        paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]
                                   ((string *)optmap);
        pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
        sshash::map::load(&map,pbVar16,true);
        std::__cxx11::string::~string((string *)&elf_parser);
        std::__cxx11::string::string((string *)&elf_parser,"minlen",(allocator *)&sp);
        paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]
                                   ((string *)optmap);
        puVar17 = boost::any_cast<unsigned_int_const&>(paVar15);
        abbrev = *puVar17;
        std::__cxx11::string::~string((string *)&elf_parser);
        sshash::sha::sha(&sha,abbrev);
        pbVar2 = input.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar21 = input.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar21 != pbVar2;
            pbVar21 = pbVar21 + 1) {
          poVar13 = std::operator<<((ostream *)&std::cout,"processing ");
          poVar13 = std::operator<<(poVar13,(string *)pbVar21);
          std::operator<<(poVar13,"\n");
          ::elf_parser::Elf_parser::Elf_parser(&elf_parser,pbVar21);
          if (elf_parser._failed == true) {
            poVar13 = std::operator<<((ostream *)&std::cerr,(string *)pbVar21);
            poVar13 = std::operator<<(poVar13,": readelf failed: ");
            poVar13 = std::operator<<(poVar13,(string *)&elf_parser._last_error);
            std::operator<<(poVar13,"\n");
LAB_00108281:
            ::elf_parser::Elf_parser::~Elf_parser(&elf_parser);
            break;
          }
          iVar6 = open((pbVar21->_M_dataplus)._M_p,2);
          if (iVar6 < 0) {
            poVar13 = std::operator<<((ostream *)&std::cerr,(string *)pbVar21);
            poVar13 = std::operator<<(poVar13," open failed: ");
            piVar20 = __errno_location();
            pcVar8 = strerror(*piVar20);
            poVar13 = std::operator<<(poVar13,pcVar8);
            std::operator<<(poVar13,"\n");
            goto LAB_00108281;
          }
          ::elf_parser::Elf_parser::get_sections(&local_238,&elf_parser);
          psVar3 = local_238.
                   super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_364 = 0;
          for (local_360 = local_238.
                           super__Vector_base<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>
                           ._M_impl.super__Vector_impl_data._M_start; local_360 != psVar3;
              local_360 = local_360 + 1) {
            psVar1 = &local_360->section_name;
            lVar18 = std::__cxx11::string::find((char *)psVar1,0x1151f1);
            if (lVar18 != -1) {
              poVar13 = std::operator<<((ostream *)&std::cout,"processing section: ");
              poVar13 = std::operator<<(poVar13,(string *)psVar1);
              std::operator<<(poVar13,"\n");
              sp._start = (uint64_t)(uint)local_360->section_offset;
              sp._size = (uint64_t)(uint)local_360->section_size;
              sp._str._M_dataplus._M_p = (pointer)&sp._str.field_2;
              sp._str._M_string_length = 0;
              sp._str.field_2._M_local_buf[0] = '\0';
              sp._end = sp._size + sp._start;
              str._M_dataplus._M_p = (pointer)&str.field_2;
              str._M_string_length = 0;
              str.field_2._M_local_buf[0] = '\0';
              sp._fd = iVar6;
              sp._offset = sp._start;
              while( true ) {
                bVar4 = string_parser::next(&sp,&str,&str_offset,&str_room);
                if (!bVar4) break;
                if (sVar12 != 0) {
                  poVar13 = std::operator<<((ostream *)&std::cout,"string:");
                  *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
                       *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xffffffb5
                       | 8;
                  poVar13 = std::operator<<(poVar13," offset: ");
                  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
                  *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
                       *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xffffffb5
                       | 2;
                  poVar13 = std::operator<<(poVar13," room: ");
                  poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
                  poVar13 = std::operator<<(poVar13," [");
                  poVar13 = std::operator<<(poVar13,(string *)&str);
                  std::operator<<(poVar13,"]\n");
                }
                if (str_room < sha._abbrev) {
                  std::operator<<((ostream *)&std::cerr,
                                  " not enough room for digest. missing pad???\n");
                  break;
                }
                hash._M_dataplus._M_p = (pointer)&hash.field_2;
                hash._M_string_length = 0;
                hash.field_2._M_local_buf[0] = '\0';
                sshash::sha::digest(&sha,&hash,&str);
                if (sVar12 != 0) {
                  poVar13 = std::operator<<((ostream *)&std::cout,"digest: ");
                  poVar13 = std::operator<<(poVar13,(string *)&hash);
                  poVar13 = std::operator<<(poVar13," [");
                  poVar13 = std::operator<<(poVar13,(string *)&str);
                  std::operator<<(poVar13,"]\n");
                }
                bVar5 = sshash::map::update(&map,&hash,&str,pbVar21);
                if (!bVar5) {
                  std::operator+(&local_180,&hash,".str");
                  boost::property_tree::
                  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::string_path(&local_60,&local_180,0x2e);
                  boost::property_tree::
                  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                  ::get<std::__cxx11::string>
                            (&s,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                                 *)&map,&local_60);
                  std::__cxx11::string::~string((string *)&local_60);
                  std::__cxx11::string::~string((string *)&local_180);
                  iVar7 = std::__cxx11::string::compare((string *)&s);
                  if (iVar7 == 0) {
                    std::__cxx11::string::~string((string *)&s);
                    goto LAB_00108031;
                  }
                  poVar13 = std::operator<<((ostream *)&std::cerr,(string *)pbVar21);
                  poVar13 = std::operator<<(poVar13,": hash collision: ");
                  poVar13 = std::operator<<(poVar13,(string *)&hash);
                  poVar13 = std::operator<<(poVar13," [");
                  poVar13 = std::operator<<(poVar13,(string *)&str);
                  poVar13 = std::operator<<(poVar13,"] [");
                  poVar13 = std::operator<<(poVar13,(string *)&s);
                  std::operator<<(poVar13,"]\n");
                  std::__cxx11::string::~string((string *)&s);
LAB_0010815d:
                  std::__cxx11::string::~string((string *)&hash);
                  break;
                }
LAB_00108031:
                if (sVar14 == 0) {
                  std::__cxx11::string::resize((ulong)&hash,(char)str_room);
                  uVar19 = pwrite(iVar6,hash._M_dataplus._M_p,str_room,str_offset);
                  if (uVar19 != str_room) {
                    poVar13 = std::operator<<((ostream *)&std::cerr,(string *)pbVar21);
                    poVar13 = std::operator<<(poVar13," write failed: ");
                    piVar20 = __errno_location();
                    pcVar8 = strerror(*piVar20);
                    poVar13 = std::operator<<(poVar13,pcVar8);
                    std::operator<<(poVar13,"\n");
                    goto LAB_0010815d;
                  }
                }
                std::__cxx11::string::~string((string *)&hash);
              }
              std::__cxx11::string::~string((string *)&str);
              std::__cxx11::string::~string((string *)&sp._str);
              if (bVar4) goto LAB_001081ce;
              local_364 = local_364 + 1;
            }
          }
          close(iVar6);
          if (local_364 == 0) {
            poVar13 = std::operator<<((ostream *)&std::cout,"warn: ");
            poVar13 = std::operator<<(poVar13,(string *)pbVar21);
            std::operator<<(poVar13," : does not contain .sshash.str sections\n");
          }
LAB_001081ce:
          std::vector<elf_parser::section_t,_std::allocator<elf_parser::section_t>_>::~vector
                    (&local_238);
          ::elf_parser::Elf_parser::~Elf_parser(&elf_parser);
          if (local_360 != psVar3) break;
        }
        std::__cxx11::string::string((string *)&elf_parser,"hashmap",(allocator *)&sp);
        paVar15 = (any *)boost::program_options::abstract_variables_map::operator[]
                                   ((string *)optmap);
        pbVar16 = boost::any_cast<std::__cxx11::string_const&>(paVar15);
        sshash::map::save(&map,pbVar16);
        std::__cxx11::string::~string((string *)&elf_parser);
        boost::property_tree::
        basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~basic_ptree(&map.super_ptree);
        iVar6 = 0;
      }
      goto LAB_00107ad9;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&elf_parser);
  }
  poVar13 = (ostream *)boost::program_options::operator<<((ostream *)&std::cout,&optdesc);
  std::endl<char,std::char_traits<char>>(poVar13);
  iVar6 = 1;
LAB_00107ad9:
  boost::program_options::positional_options_description::~positional_options_description(&popt);
  boost::program_options::options_description::~options_description(&optdesc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&input);
  return iVar6;
}

Assistant:

int main(int argc, char* argv[])
{
	std::vector<std::string> input;

	// **** Parse command line arguments ****
	po::options_description optdesc("sshash-elf -- tool for processing sshash stings in ELF files\n"
				"Usage: sshash-elf <--hashmap map> [options] [elf-input-files]\n"
				"Options");
	optdesc.add_options()
		("help", "Print this message")
		("input",     po::value<std::vector<std::string> >(&input)->composing(), "Input ELF file. Multiple files can be specified.")
		("hashmap,m", po::value<std::string>(), "Output hasmap file.")
		("minlen,L",  po::value<unsigned int>()->default_value(8), "Length of the hash value (aka min string length)")
		("dryrun",    "Generate hashmap file but do not modify input files")
		("verbose",   "Show verbose info (digest values, etc)");

	po::positional_options_description popt;
	popt.add("input", -1);

	po::store(po::command_line_parser(argc, argv).
	          options(optdesc).positional(popt).run(), optmap);

	po::notify(optmap);

	// ** All argument values (including the defaults) are now storred in 'optmap' **

	if (optmap.count("help") || input.empty()) {
		std::cout << optdesc << std::endl;
		return 1;
	}

	opt_verbose = optmap.count("verbose");
	opt_dryrun  = optmap.count("dryrun");

	char usage_banner[] = "usage: sshash-tool [<elf_file>] [<ssiMapFilename>]\n";
	if(argc < 3) {
		std::cerr << usage_banner;
		return -1;
	}

	sshash::map map;

	// Load map.
	// This may fail if the map doesn't exist yet.
	map.load(optmap["hashmap"].as<std::string>(), true /* optional */);

	// Init hash generator
	const unsigned int minlen = optmap["minlen"].as<unsigned int>();
	sshash::sha sha(minlen);

	// Process all inputs
	for (auto &i : input) {
		if (!elf_process(map, sha, i))
			break;
	}

	// Save updated map
	map.save(optmap["hashmap"].as<std::string>());
	return 0;
}